

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_gold_rewards_handling.hpp
# Opt level: O0

void PatchImproveGoldRewardsHandling::handle_gold_rewards_for_npc
               (ROM *rom,uint32_t function_check_gold_reward)

{
  uint32_t uVar1;
  Code *code;
  Code local_2e8;
  allocator<char> local_269;
  string local_268;
  uint32_t local_248;
  allocator<char> local_241;
  uint32_t addr;
  DataRegister local_220;
  allocator<char> local_209;
  string local_208;
  DataRegister local_1e8;
  allocator<char> local_1d1;
  string local_1d0;
  Param local_1b0 [2];
  DataRegister local_1a0;
  DataRegister local_190;
  allocator<char> local_179;
  string local_178;
  DataRegister local_158;
  allocator<char> local_141;
  string local_140;
  DataRegister local_120;
  allocator<char> local_109;
  string local_108;
  DataRegister local_e8;
  DataRegister local_d8;
  Param local_c8 [4];
  DataRegister local_a8;
  undefined1 local_98 [8];
  Code proc_check_if_item_is_golds;
  uint32_t JUMP_ADDR_NO_REWARD;
  uint32_t JUMP_ADDR_GOLD_REWARD;
  uint32_t JUMP_ADDR_ITEM_REWARD;
  uint32_t function_check_gold_reward_local;
  ROM *rom_local;
  
  proc_check_if_item_is_golds._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       0x28ef0;
  proc_check_if_item_is_golds._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       0x28ed2;
  md::Code::Code((Code *)local_98);
  md::DataRegister::DataRegister(&local_a8,'\0');
  md::Code::clrl((Code *)local_98,(Param *)&local_a8);
  addr_<void>((uint32_t)local_c8,0xff1196);
  md::DataRegister::DataRegister(&local_d8,'\0');
  md::Code::movew((Code *)local_98,local_c8,(Param *)&local_d8);
  md::DataRegister::DataRegister(&local_e8,'\0');
  md::Code::cmpiw((Code *)local_98,0x7f,(Param *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"item_not_archipelago",&local_109);
  md::Code::bne((Code *)local_98,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  md::DataRegister::DataRegister(&local_120,'\0');
  md::Code::movew((Code *)local_98,0x1e,(Param *)&local_120);
  md::Code::jmp((Code *)local_98,0x28ed2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"item_not_archipelago",&local_141);
  md::Code::label((Code *)local_98,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  md::DataRegister::DataRegister(&local_158,'\0');
  md::Code::cmpiw((Code *)local_98,0x40,(Param *)&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"item_not_golds",&local_179);
  md::Code::blt((Code *)local_98,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  md::DataRegister::DataRegister(&local_190,'\0');
  md::Code::subiw((Code *)local_98,0x40,(Param *)&local_190);
  md::Code::jsr((Code *)local_98,function_check_gold_reward);
  md::DataRegister::DataRegister(&local_1a0,'\0');
  addr_<void>((uint32_t)local_1b0,0xff1878);
  md::Code::movel((Code *)local_98,(Param *)&local_1a0,local_1b0);
  md::Code::jmp((Code *)local_98,0x28ef0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"item_not_golds",&local_1d1);
  md::Code::label((Code *)local_98,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  md::DataRegister::DataRegister(&local_1e8,'\0');
  md::Code::cmpiw((Code *)local_98,0x3f,(Param *)&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"item_not_empty",&local_209);
  md::Code::bne((Code *)local_98,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  md::DataRegister::DataRegister(&local_220,'\0');
  md::Code::movew((Code *)local_98,0x1d,(Param *)&local_220);
  md::Code::jmp((Code *)local_98,0x28ed2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&addr,"item_not_empty",&local_241);
  md::Code::label((Code *)local_98,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  std::allocator<char>::~allocator(&local_241);
  md::Code::jmp((Code *)local_98,0x28eca);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"",&local_269);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_98,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  local_2e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_2e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_2e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_2e8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2e8._labels._M_t._M_impl._0_8_ = 0;
  local_2e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_2e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_2e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_2e8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_2e8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8._pending_branches._M_t._M_impl._0_8_ = 0;
  local_2e8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_248 = uVar1;
  md::Code::Code(&local_2e8);
  code = md::Code::jmp(&local_2e8,local_248);
  md::ROM::set_code(rom,0x28ec4,code);
  md::Code::~Code(&local_2e8);
  md::Code::~Code((Code *)local_98);
  return;
}

Assistant:

static void handle_gold_rewards_for_npc(md::ROM& rom, uint32_t function_check_gold_reward)
    {
        constexpr uint32_t JUMP_ADDR_ITEM_REWARD = 0x28ECA;
        constexpr uint32_t JUMP_ADDR_GOLD_REWARD = 0x28EF0;
        constexpr uint32_t JUMP_ADDR_NO_REWARD = 0x28ED2;

        md::Code proc_check_if_item_is_golds;
        {
            proc_check_if_item_is_golds.clrl(reg_D0);
            proc_check_if_item_is_golds.movew(addr_(0xFF1196), reg_D0);
            proc_check_if_item_is_golds.cmpiw(ITEM_ARCHIPELAGO, reg_D0);
            proc_check_if_item_is_golds.bne("item_not_archipelago");
            {
                // Archipelago item case
                proc_check_if_item_is_golds.movew(0x1E, reg_D0);
                proc_check_if_item_is_golds.jmp(JUMP_ADDR_NO_REWARD);
            }
            proc_check_if_item_is_golds.label("item_not_archipelago");
            proc_check_if_item_is_golds.cmpiw(ITEM_GOLDS_START, reg_D0);
            proc_check_if_item_is_golds.blt("item_not_golds");
            {
                // Gold reward case
                proc_check_if_item_is_golds.subiw(ITEM_GOLDS_START, reg_D0);
                proc_check_if_item_is_golds.jsr(function_check_gold_reward);
                proc_check_if_item_is_golds.movel(reg_D0, addr_(0xFF1878));
                proc_check_if_item_is_golds.jmp(JUMP_ADDR_GOLD_REWARD);
            }
            proc_check_if_item_is_golds.label("item_not_golds");
            proc_check_if_item_is_golds.cmpiw(ITEM_NONE, reg_D0);
            proc_check_if_item_is_golds.bne("item_not_empty");
            {
                // No item case
                proc_check_if_item_is_golds.movew(0x1D, reg_D0);
                proc_check_if_item_is_golds.jmp(JUMP_ADDR_NO_REWARD);
            }
            proc_check_if_item_is_golds.label("item_not_empty");
            // Item reward case
            proc_check_if_item_is_golds.jmp(JUMP_ADDR_ITEM_REWARD);
        }
        uint32_t addr = rom.inject_code(proc_check_if_item_is_golds);

        rom.set_code(0x28EC4, md::Code().jmp(addr));
    }